

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void read_path(char **r,char *start)

{
  char cVar1;
  bool doBreak;
  char *start_local;
  char **r_local;
  
  do {
    if (*r < start) {
      return;
    }
    cVar1 = **r;
    *r = *r + -1;
  } while (cVar1 != '/');
  return;
}

Assistant:

static void read_path(char *&r, char *start)
{
    while(1)
    {
        if(r<start)
            break;
        bool doBreak = *r=='/';
        r--;
        if(doBreak)
            break;
    }
}